

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O3

int __thiscall
viennamath::rt_latex_function_symbol_processor<viennamath::rt_expression_interface<double>_>::clone
          (rt_latex_function_symbol_processor<viennamath::rt_expression_interface<double>_> *this,
          __fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x38);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  *puVar1 = &PTR_clone_00126be8;
  puVar1[3] = 0;
  puVar1[4] = puVar1 + 2;
  puVar1[5] = puVar1 + 2;
  puVar1[6] = 0;
  return (int)puVar1;
}

Assistant:

rt_latex_processor_interface<InterfaceType> * clone() const { return new rt_latex_function_symbol_processor(); }